

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

int lws_json_simple_strcmp(char *buf,size_t len,char *name,char *comp)

{
  int iVar1;
  char *__s1;
  size_t sVar2;
  size_t al;
  size_t local_20;
  
  __s1 = lws_json_simple_find(buf,len,name,&local_20);
  if (__s1 != (char *)0x0) {
    sVar2 = strlen(comp);
    if (local_20 == sVar2) {
      iVar1 = strncmp(__s1,comp,local_20);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
lws_json_simple_strcmp(const char *buf, size_t len, const char *name,
		       const char *comp)
{
	size_t al;
	const char *hit = lws_json_simple_find(buf, len, name, &al);

	if (!hit)
		return -1;

	if (al != strlen(comp))
		return -1;

	return strncmp(hit, comp, al);
}